

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void destroy_context(Context *ctx)

{
  void *d;
  ConstantsList *pCVar1;
  RegisterList *pRVar2;
  VariableList *pVVar3;
  ConstantsList *pCVar4;
  RegisterList *pRVar5;
  VariableList *pVVar6;
  code *UNRECOVERED_JUMPTABLE;
  
  if (ctx == (Context *)0x0) {
    return;
  }
  UNRECOVERED_JUMPTABLE = ctx->free;
  if (UNRECOVERED_JUMPTABLE == (MOJOSHADER_free)0x0) {
    UNRECOVERED_JUMPTABLE = MOJOSHADER_internal_free;
  }
  d = ctx->malloc_data;
  buffer_destroy(ctx->preflight);
  buffer_destroy(ctx->globals);
  buffer_destroy(ctx->inputs);
  buffer_destroy(ctx->outputs);
  buffer_destroy(ctx->helpers);
  buffer_destroy(ctx->subroutines);
  buffer_destroy(ctx->mainline_intro);
  buffer_destroy(ctx->mainline_arguments);
  buffer_destroy(ctx->mainline_top);
  buffer_destroy(ctx->mainline);
  buffer_destroy(ctx->postflight);
  buffer_destroy(ctx->ignore);
  pCVar4 = ctx->constants;
  while (pCVar4 != (ConstantsList *)0x0) {
    pCVar1 = pCVar4->next;
    (*UNRECOVERED_JUMPTABLE)(pCVar4,d);
    pCVar4 = pCVar1;
  }
  pRVar5 = (ctx->used_registers).next;
  while (pRVar5 != (RegisterList *)0x0) {
    pRVar2 = pRVar5->next;
    (*UNRECOVERED_JUMPTABLE)(pRVar5,d);
    pRVar5 = pRVar2;
  }
  pRVar5 = (ctx->defined_registers).next;
  while (pRVar5 != (RegisterList *)0x0) {
    pRVar2 = pRVar5->next;
    (*UNRECOVERED_JUMPTABLE)(pRVar5,d);
    pRVar5 = pRVar2;
  }
  pRVar5 = (ctx->uniforms).next;
  while (pRVar5 != (RegisterList *)0x0) {
    pRVar2 = pRVar5->next;
    (*UNRECOVERED_JUMPTABLE)(pRVar5,d);
    pRVar5 = pRVar2;
  }
  pRVar5 = (ctx->attributes).next;
  while (pRVar5 != (RegisterList *)0x0) {
    pRVar2 = pRVar5->next;
    (*UNRECOVERED_JUMPTABLE)(pRVar5,d);
    pRVar5 = pRVar2;
  }
  pRVar5 = (ctx->samplers).next;
  while (pRVar5 != (RegisterList *)0x0) {
    pRVar2 = pRVar5->next;
    (*UNRECOVERED_JUMPTABLE)(pRVar5,d);
    pRVar5 = pRVar2;
  }
  pVVar6 = ctx->variables;
  while (pVVar6 != (VariableList *)0x0) {
    pVVar3 = pVVar6->next;
    (*UNRECOVERED_JUMPTABLE)(pVVar6,d);
    pVVar6 = pVVar3;
  }
  errorlist_destroy(ctx->errors);
  free_symbols(UNRECOVERED_JUMPTABLE,d,(ctx->ctab).symbols,(ctx->ctab).symbol_count);
  MOJOSHADER_freePreshader(ctx->preshader);
  (*UNRECOVERED_JUMPTABLE)(ctx->mainfn,d);
  (*UNRECOVERED_JUMPTABLE)(ctx,d);
  return;
}

Assistant:

static void destroy_context(Context *ctx)
{
    if (ctx != NULL)
    {
        MOJOSHADER_free f = ((ctx->free != NULL) ? ctx->free : MOJOSHADER_internal_free);
        void *d = ctx->malloc_data;
        buffer_destroy(ctx->preflight);
        buffer_destroy(ctx->globals);
        buffer_destroy(ctx->inputs);
        buffer_destroy(ctx->outputs);
        buffer_destroy(ctx->helpers);
        buffer_destroy(ctx->subroutines);
        buffer_destroy(ctx->mainline_intro);
        buffer_destroy(ctx->mainline_arguments);
        buffer_destroy(ctx->mainline_top);
        buffer_destroy(ctx->mainline);
        buffer_destroy(ctx->postflight);
        buffer_destroy(ctx->ignore);
        free_constants_list(f, d, ctx->constants);
        free_reglist(f, d, ctx->used_registers.next);
        free_reglist(f, d, ctx->defined_registers.next);
        free_reglist(f, d, ctx->uniforms.next);
        free_reglist(f, d, ctx->attributes.next);
        free_reglist(f, d, ctx->samplers.next);
        free_variable_list(f, d, ctx->variables);
        errorlist_destroy(ctx->errors);
        free_symbols(f, d, ctx->ctab.symbols, ctx->ctab.symbol_count);
        MOJOSHADER_freePreshader(ctx->preshader);
        f((void *) ctx->mainfn, d);
        f(ctx, d);
    } // if
}